

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginFunctionBody
          (BinaryReaderIR *this,Index index,Offset size)

{
  Func *pFVar1;
  Location local_38;
  
  pFVar1 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
           _M_impl.super__Vector_impl_data._M_start[index];
  this->current_func_ = pFVar1;
  GetLocation(&local_38,this);
  (pFVar1->loc).field_1.field_1.offset = (size_t)local_38.field_1.field_1.offset;
  *(undefined8 *)((long)&(pFVar1->loc).field_1 + 8) = local_38.field_1._8_8_;
  (pFVar1->loc).filename._M_len = local_38.filename._M_len;
  (pFVar1->loc).filename._M_str = local_38.filename._M_str;
  PushLabel(this,First,&this->current_func_->exprs,(Expr *)0x0);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginFunctionBody(Index index, Offset size) {
  current_func_ = module_->funcs[index];
  current_func_->loc = GetLocation();
  PushLabel(LabelType::Func, &current_func_->exprs);
  return Result::Ok;
}